

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_statistics.cpp
# Opt level: O2

Statistics * __thiscall
embree::BVHNStatistics<4>::statistics
          (Statistics *__return_storage_ptr__,BVHNStatistics<4> *this,NodeRef node,double A,
          BBox1f t0t1)

{
  size_t *psVar1;
  long *plVar2;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_00;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_01;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_02;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_03;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_04;
  NodeStat<embree::AABBNode_t<embree::NodeRefPtr<4>,_4>_> statAABBNodes_05;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_00;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_01;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_02;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_03;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_04;
  NodeStat<embree::OBBNode_t<embree::NodeRefPtr<4>,_4>_> statOBBNodes_05;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_00;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_01;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_02;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_03;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_04;
  NodeStat<embree::AABBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB_05;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_00;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_01;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_02;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_03;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_04;
  NodeStat<embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>_> statAABBNodesMB4D_05;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_00;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_01;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_02;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_03;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_04;
  NodeStat<embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>_> statOBBNodesMB_05;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_00;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_01;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_02;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_03;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_04;
  NodeStat<embree::QuantizedNode_t<embree::NodeRefPtr<4>,_4>_> statQuantizedNodes_05;
  char cVar3;
  long lVar4;
  runtime_error *prVar5;
  long lVar6;
  size_t sVar7;
  LeafStat *pLVar8;
  double *pdVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  byte bVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  LeafStat in_stack_fffffffffffff2d8;
  BBox1f t0t1_local;
  AABBNode *n;
  undefined1 local_c08 [24];
  anon_class_16_2_ed117de8_conflict13 local_bf0;
  blocked_range<int> local_be0;
  size_t local_bd0;
  anon_class_24_3_c8748052 local_bc8;
  anon_class_24_3_8ee612a4_conflict2 local_bb0;
  double local_b98;
  size_t sStack_b90;
  size_t local_b88;
  size_t local_b78;
  size_t sStack_b70;
  double local_b68;
  size_t local_b58;
  double dStack_b50;
  size_t local_b48;
  double local_b38;
  size_t sStack_b30;
  size_t local_b28;
  size_t local_b18;
  size_t sStack_b10;
  size_t local_b08;
  undefined8 local_af8;
  undefined8 uStack_af0;
  size_t local_ae8;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  size_t local_ac8;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  size_t local_aa8;
  undefined8 local_a98;
  undefined8 uStack_a90;
  size_t local_a88;
  undefined8 local_a78;
  undefined8 uStack_a70;
  size_t local_a68;
  undefined8 local_a58;
  undefined8 uStack_a50;
  size_t local_a48;
  undefined8 local_a38;
  undefined8 uStack_a30;
  size_t local_a28;
  undefined8 local_a18;
  undefined8 uStack_a10;
  size_t local_a08;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  size_t local_9e8;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  size_t local_9c8;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  size_t local_9a8;
  undefined8 local_998;
  undefined8 uStack_990;
  size_t local_988;
  undefined8 local_978;
  undefined8 uStack_970;
  size_t local_968;
  undefined8 local_958;
  undefined8 uStack_950;
  size_t local_948;
  undefined8 local_938;
  undefined8 uStack_930;
  size_t local_928;
  undefined8 local_918;
  undefined8 uStack_910;
  size_t local_908;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  size_t local_8e8;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  size_t local_8c8;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  size_t local_8a8;
  undefined8 local_898;
  undefined8 uStack_890;
  size_t local_888;
  undefined8 local_878;
  undefined8 uStack_870;
  size_t local_868;
  undefined8 local_858;
  undefined8 uStack_850;
  size_t local_848;
  undefined8 local_838;
  undefined8 uStack_830;
  size_t local_828;
  undefined8 local_818;
  undefined8 uStack_810;
  size_t local_808;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  size_t local_7e8;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  size_t local_7c8;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  size_t local_7a8;
  undefined8 local_798;
  undefined8 uStack_790;
  size_t local_788;
  undefined8 local_778;
  undefined8 uStack_770;
  size_t local_768;
  undefined8 local_758;
  undefined8 uStack_750;
  size_t local_748;
  undefined8 local_738;
  undefined8 uStack_730;
  size_t local_728;
  undefined8 local_718;
  undefined8 uStack_710;
  size_t local_708;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  size_t local_6e8;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  size_t local_6c8;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  size_t local_6a8;
  undefined8 local_698;
  undefined8 uStack_690;
  size_t local_688;
  undefined8 local_678;
  undefined8 uStack_670;
  size_t local_668;
  task_group_context context;
  Statistics v;
  Statistics local_448;
  LeafStat local_340;
  LeafStat local_2d0;
  LeafStat local_260;
  LeafStat local_1f0;
  LeafStat local_180;
  LeafStat local_110;
  LeafStat local_a0;
  
  bVar13 = 0;
  local_c08._8_4_ = in_XMM1_Dc;
  local_c08._0_8_ = t0t1;
  local_c08._12_4_ = in_XMM1_Dd;
  t0t1_local = t0t1;
  Statistics::LeafStat::LeafStat(&local_a0,0.0,0,0,0,0,0);
  local_678 = 0;
  uStack_670 = 0;
  local_668 = 0;
  local_698 = 0;
  uStack_690 = 0;
  local_688 = 0;
  local_6b8 = 0;
  uStack_6b0 = 0;
  local_6a8 = 0;
  local_6d8 = 0;
  uStack_6d0 = 0;
  local_6c8 = 0;
  local_6f8 = 0;
  uStack_6f0 = 0;
  local_6e8 = 0;
  local_718 = 0;
  uStack_710 = 0;
  local_708 = 0;
  pLVar8 = &local_a0;
  pdVar9 = (double *)&stack0xfffffffffffff2d8;
  for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
    *pdVar9 = pLVar8->leafSAH;
    pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
    pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
  }
  statAABBNodes.numNodes = uStack_670;
  statAABBNodes.nodeSAH = (double)local_678;
  statAABBNodes.numChildren = local_668;
  statOBBNodes.numNodes = uStack_690;
  statOBBNodes.nodeSAH = (double)local_698;
  statOBBNodes.numChildren = local_688;
  statAABBNodesMB.numNodes = uStack_6b0;
  statAABBNodesMB.nodeSAH = (double)local_6b8;
  statAABBNodesMB.numChildren = local_6a8;
  statAABBNodesMB4D.numNodes = uStack_6d0;
  statAABBNodesMB4D.nodeSAH = (double)local_6d8;
  statAABBNodesMB4D.numChildren = local_6c8;
  statOBBNodesMB.numNodes = uStack_6f0;
  statOBBNodesMB.nodeSAH = (double)local_6f8;
  statOBBNodesMB.numChildren = local_6e8;
  statQuantizedNodes.numNodes = uStack_710;
  statQuantizedNodes.nodeSAH = (double)local_718;
  statQuantizedNodes.numChildren = local_708;
  Statistics::Statistics
            (__return_storage_ptr__,0,in_stack_fffffffffffff2d8,statAABBNodes,statOBBNodes,
             statAABBNodesMB,statAABBNodesMB4D,statOBBNodesMB,statQuantizedNodes);
  fVar14 = (float)local_c08._4_4_ - (float)local_c08._0_4_;
  if (fVar14 <= 0.0) {
    fVar14 = 0.0;
  }
  local_c08._0_8_ = (double)fVar14;
  uVar10 = (ulong)((uint)node.ptr & 0xf);
  local_bc8.this = this;
  local_bc8.t0t1 = (BBox1f *)this;
  switch(uVar10) {
  case 0:
    n = (AABBNode *)node.ptr;
    Statistics::LeafStat::LeafStat(&local_110,0.0,0,0,0,0,0);
    local_738 = 0;
    uStack_730 = 0;
    local_728 = 0;
    local_758 = 0;
    uStack_750 = 0;
    local_748 = 0;
    local_778 = 0;
    uStack_770 = 0;
    local_768 = 0;
    local_798 = 0;
    uStack_790 = 0;
    local_788 = 0;
    local_7b8 = 0;
    uStack_7b0 = 0;
    local_7a8 = 0;
    local_7d8 = 0;
    uStack_7d0 = 0;
    local_7c8 = 0;
    pLVar8 = &local_110;
    pdVar9 = (double *)&stack0xfffffffffffff2d8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
    }
    statAABBNodes_00.numNodes = uStack_730;
    statAABBNodes_00.nodeSAH = (double)local_738;
    statAABBNodes_00.numChildren = local_728;
    statOBBNodes_00.numNodes = uStack_750;
    statOBBNodes_00.nodeSAH = (double)local_758;
    statOBBNodes_00.numChildren = local_748;
    statAABBNodesMB_00.numNodes = uStack_770;
    statAABBNodesMB_00.nodeSAH = (double)local_778;
    statAABBNodesMB_00.numChildren = local_768;
    statAABBNodesMB4D_00.numNodes = uStack_790;
    statAABBNodesMB4D_00.nodeSAH = (double)local_798;
    statAABBNodesMB4D_00.numChildren = local_788;
    statOBBNodesMB_00.numNodes = uStack_7b0;
    statOBBNodesMB_00.nodeSAH = (double)local_7b8;
    statOBBNodesMB_00.numChildren = local_7a8;
    statQuantizedNodes_00.numNodes = uStack_7d0;
    statQuantizedNodes_00.nodeSAH = (double)local_7d8;
    statQuantizedNodes_00.numChildren = local_7c8;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff2d8,statAABBNodes_00,statOBBNodes_00,
               statAABBNodesMB_00,statAABBNodesMB4D_00,statOBBNodesMB_00,statQuantizedNodes_00);
    local_bb0.func = &local_bc8;
    local_bc8.t0t1 = &t0t1_local;
    local_bb0.reduction = Statistics::add;
    local_bc8.n = &n;
    local_bb0.identity = &local_448;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_be0.my_end = 4;
    local_be0.my_begin = 0;
    local_be0.my_grainsize = 1;
    local_bf0.reduction = Statistics::add;
    local_bf0.func = &local_bb0;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
              (&v,&local_be0,&local_448,&local_bf0,Statistics::add,&context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    operator+((Statistics *)&context,__return_storage_ptr__,&v);
    memcpy(__return_storage_ptr__,(Statistics *)&context,0x108);
    psVar1 = &(__return_storage_ptr__->statAABBNodes).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statAABBNodes).nodeSAH =
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statAABBNodes).nodeSAH;
    break;
  case 1:
    n = (AABBNode *)(node.ptr & 0xfffffffffffffff0);
    Statistics::LeafStat::LeafStat(&local_1f0,0.0,0,0,0,0,0);
    local_8b8 = 0;
    uStack_8b0 = 0;
    local_8a8 = 0;
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8c8 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_8e8 = 0;
    local_918 = 0;
    uStack_910 = 0;
    local_908 = 0;
    local_938 = 0;
    uStack_930 = 0;
    local_928 = 0;
    local_958 = 0;
    uStack_950 = 0;
    local_948 = 0;
    pLVar8 = &local_1f0;
    pdVar9 = (double *)&stack0xfffffffffffff2d8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
    }
    statAABBNodes_03.numNodes = uStack_8b0;
    statAABBNodes_03.nodeSAH = (double)local_8b8;
    statAABBNodes_03.numChildren = local_8a8;
    statOBBNodes_03.numNodes = uStack_8d0;
    statOBBNodes_03.nodeSAH = (double)local_8d8;
    statOBBNodes_03.numChildren = local_8c8;
    statAABBNodesMB_03.numNodes = uStack_8f0;
    statAABBNodesMB_03.nodeSAH = (double)local_8f8;
    statAABBNodesMB_03.numChildren = local_8e8;
    statAABBNodesMB4D_03.numNodes = uStack_910;
    statAABBNodesMB4D_03.nodeSAH = (double)local_918;
    statAABBNodesMB4D_03.numChildren = local_908;
    statOBBNodesMB_03.numNodes = uStack_930;
    statOBBNodesMB_03.nodeSAH = (double)local_938;
    statOBBNodesMB_03.numChildren = local_928;
    statQuantizedNodes_03.numNodes = uStack_950;
    statQuantizedNodes_03.nodeSAH = (double)local_958;
    statQuantizedNodes_03.numChildren = local_948;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff2d8,statAABBNodes_03,statOBBNodes_03,
               statAABBNodesMB_03,statAABBNodesMB4D_03,statOBBNodesMB_03,statQuantizedNodes_03);
    local_bb0.func = &local_bc8;
    local_bc8.this = (BVHNStatistics<4> *)&t0t1_local;
    local_bb0.reduction = Statistics::add;
    local_bc8.n = &n;
    local_bb0.identity = &local_448;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_be0.my_end = 4;
    local_be0.my_begin = 0;
    local_be0.my_grainsize = 1;
    local_bf0.reduction = Statistics::add;
    local_bf0.func = &local_bb0;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
              (&v,&local_be0,&local_448,&local_bf0,Statistics::add,&context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    operator+((Statistics *)&context,__return_storage_ptr__,&v);
    memcpy(__return_storage_ptr__,(Statistics *)&context,0x108);
    psVar1 = &(__return_storage_ptr__->statAABBNodesMB).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statAABBNodesMB).nodeSAH =
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statAABBNodesMB).nodeSAH;
    break;
  case 2:
    n = (AABBNode *)(node.ptr & 0xfffffffffffffff0);
    Statistics::LeafStat::LeafStat(&local_180,0.0,0,0,0,0,0);
    local_7f8 = 0;
    uStack_7f0 = 0;
    local_7e8 = 0;
    local_818 = 0;
    uStack_810 = 0;
    local_808 = 0;
    local_838 = 0;
    uStack_830 = 0;
    local_828 = 0;
    local_858 = 0;
    uStack_850 = 0;
    local_848 = 0;
    local_878 = 0;
    uStack_870 = 0;
    local_868 = 0;
    local_898 = 0;
    uStack_890 = 0;
    local_888 = 0;
    pLVar8 = &local_180;
    pdVar9 = (double *)&stack0xfffffffffffff2d8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
    }
    statAABBNodes_01.numNodes = uStack_7f0;
    statAABBNodes_01.nodeSAH = (double)local_7f8;
    statAABBNodes_01.numChildren = local_7e8;
    statOBBNodes_01.numNodes = uStack_810;
    statOBBNodes_01.nodeSAH = (double)local_818;
    statOBBNodes_01.numChildren = local_808;
    statAABBNodesMB_01.numNodes = uStack_830;
    statAABBNodesMB_01.nodeSAH = (double)local_838;
    statAABBNodesMB_01.numChildren = local_828;
    statAABBNodesMB4D_01.numNodes = uStack_850;
    statAABBNodesMB4D_01.nodeSAH = (double)local_858;
    statAABBNodesMB4D_01.numChildren = local_848;
    statOBBNodesMB_01.numNodes = uStack_870;
    statOBBNodesMB_01.nodeSAH = (double)local_878;
    statOBBNodesMB_01.numChildren = local_868;
    statQuantizedNodes_01.numNodes = uStack_890;
    statQuantizedNodes_01.nodeSAH = (double)local_898;
    statQuantizedNodes_01.numChildren = local_888;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff2d8,statAABBNodes_01,statOBBNodes_01,
               statAABBNodesMB_01,statAABBNodesMB4D_01,statOBBNodesMB_01,statQuantizedNodes_01);
    local_bb0.func = &local_bc8;
    local_bc8.t0t1 = &t0t1_local;
    local_bb0.reduction = Statistics::add;
    local_bc8.n = &n;
    local_bb0.identity = &local_448;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_be0.my_end = 4;
    local_be0.my_begin = 0;
    local_be0.my_grainsize = 1;
    local_bf0.reduction = Statistics::add;
    local_bf0.func = &local_bb0;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
              (&v,&local_be0,&local_448,&local_bf0,Statistics::add,&context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    operator+((Statistics *)&context,__return_storage_ptr__,&v);
    memcpy(__return_storage_ptr__,(Statistics *)&context,0x108);
    psVar1 = &(__return_storage_ptr__->statOBBNodes).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statOBBNodes).nodeSAH =
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statOBBNodes).nodeSAH;
    break;
  case 3:
    n = (AABBNode *)(node.ptr & 0xfffffffffffffff0);
    Statistics::LeafStat::LeafStat(&local_2d0,0.0,0,0,0,0,0);
    local_a38 = 0;
    uStack_a30 = 0;
    local_a28 = 0;
    local_a58 = 0;
    uStack_a50 = 0;
    local_a48 = 0;
    local_a78 = 0;
    uStack_a70 = 0;
    local_a68 = 0;
    local_a98 = 0;
    uStack_a90 = 0;
    local_a88 = 0;
    local_ab8 = 0;
    uStack_ab0 = 0;
    local_aa8 = 0;
    local_ad8 = 0;
    uStack_ad0 = 0;
    local_ac8 = 0;
    pLVar8 = &local_2d0;
    pdVar9 = (double *)&stack0xfffffffffffff2d8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
    }
    statAABBNodes_04.numNodes = uStack_a30;
    statAABBNodes_04.nodeSAH = (double)local_a38;
    statAABBNodes_04.numChildren = local_a28;
    statOBBNodes_04.numNodes = uStack_a50;
    statOBBNodes_04.nodeSAH = (double)local_a58;
    statOBBNodes_04.numChildren = local_a48;
    statAABBNodesMB_04.numNodes = uStack_a70;
    statAABBNodesMB_04.nodeSAH = (double)local_a78;
    statAABBNodesMB_04.numChildren = local_a68;
    statAABBNodesMB4D_04.numNodes = uStack_a90;
    statAABBNodesMB4D_04.nodeSAH = (double)local_a98;
    statAABBNodesMB4D_04.numChildren = local_a88;
    statOBBNodesMB_04.numNodes = uStack_ab0;
    statOBBNodesMB_04.nodeSAH = (double)local_ab8;
    statOBBNodesMB_04.numChildren = local_aa8;
    statQuantizedNodes_04.numNodes = uStack_ad0;
    statQuantizedNodes_04.nodeSAH = (double)local_ad8;
    statQuantizedNodes_04.numChildren = local_ac8;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff2d8,statAABBNodes_04,statOBBNodes_04,
               statAABBNodesMB_04,statAABBNodesMB4D_04,statOBBNodesMB_04,statQuantizedNodes_04);
    local_bb0.func = &local_bc8;
    local_bc8.t0t1 = &t0t1_local;
    local_bb0.reduction = Statistics::add;
    local_bc8.n = &n;
    local_bb0.identity = &local_448;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_be0.my_end = 4;
    local_be0.my_begin = 0;
    local_be0.my_grainsize = 1;
    local_bf0.reduction = Statistics::add;
    local_bf0.func = &local_bb0;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
              (&v,&local_be0,&local_448,&local_bf0,Statistics::add,&context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    operator+((Statistics *)&context,__return_storage_ptr__,&v);
    memcpy(__return_storage_ptr__,(Statistics *)&context,0x108);
    psVar1 = &(__return_storage_ptr__->statOBBNodesMB).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statOBBNodesMB).nodeSAH =
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statOBBNodesMB).nodeSAH;
    break;
  default:
    if ((node.ptr & 8) == 0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"not supported node type in bvh_statistics");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar7 = uVar10 - 8;
    if (sVar7 == 0) {
      return __return_storage_ptr__;
    }
    uVar11 = node.ptr & 0xfffffffffffffff0;
    local_bd0 = sVar7;
    while (bVar12 = sVar7 != 0, sVar7 = sVar7 - 1, bVar12) {
      plVar2 = *(long **)&(this->bvh->super_AccelData).field_0x58;
      lVar6 = (**(code **)(*plVar2 + 0x18))(plVar2,uVar11);
      plVar2 = *(long **)&(this->bvh->super_AccelData).field_0x58;
      lVar4 = (**(code **)(*plVar2 + 8))(plVar2,uVar11);
      psVar1 = &(__return_storage_ptr__->statLeaf).numPrimsActive;
      *psVar1 = *psVar1 + lVar4;
      plVar2 = *(long **)&(this->bvh->super_AccelData).field_0x58;
      lVar4 = (**(code **)(*plVar2 + 0x10))(plVar2,uVar11);
      psVar1 = &(__return_storage_ptr__->statLeaf).numPrimsTotal;
      *psVar1 = *psVar1 + lVar4;
      psVar1 = &(__return_storage_ptr__->statLeaf).numBytes;
      *psVar1 = *psVar1 + lVar6;
      uVar11 = uVar11 + lVar6;
    }
    psVar1 = &(__return_storage_ptr__->statLeaf).numLeaves;
    *psVar1 = *psVar1 + 1;
    psVar1 = &(__return_storage_ptr__->statLeaf).numPrimBlocks;
    *psVar1 = *psVar1 + local_bd0;
    auVar15._8_4_ = (int)(local_bd0 >> 0x20);
    auVar15._0_8_ = local_bd0;
    auVar15._12_4_ = 0x45300000;
    (__return_storage_ptr__->statLeaf).leafSAH =
         ((auVar15._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_bd0) - 4503599627370496.0)) *
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statLeaf).leafSAH;
    if (7 < uVar10 - 9) {
      return __return_storage_ptr__;
    }
    psVar1 = (__return_storage_ptr__->statLeaf).numPrimBlocksHistogram + (uVar10 - 9);
    *psVar1 = *psVar1 + 1;
    return __return_storage_ptr__;
  case 5:
    n = (AABBNode *)(node.ptr & 0xfffffffffffffff0);
    Statistics::LeafStat::LeafStat(&local_340,0.0,0,0,0,0,0);
    local_af8 = 0;
    uStack_af0 = 0;
    local_ae8 = 0;
    local_b18 = 0;
    sStack_b10 = 0;
    local_b08 = 0;
    local_b38 = 0.0;
    sStack_b30 = 0;
    local_b28 = 0;
    local_b58 = 0;
    dStack_b50 = 0.0;
    local_b48 = 0;
    local_b78 = 0;
    sStack_b70 = 0;
    local_b68 = 0.0;
    local_b98 = 0.0;
    sStack_b90 = 0;
    local_b88 = 0;
    pLVar8 = &local_340;
    pdVar9 = (double *)&stack0xfffffffffffff2d8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
    }
    statAABBNodes_05.numNodes = uStack_af0;
    statAABBNodes_05.nodeSAH = (double)local_af8;
    statAABBNodes_05.numChildren = local_ae8;
    statOBBNodes_05.numNodes = sStack_b10;
    statOBBNodes_05.nodeSAH = (double)local_b18;
    statOBBNodes_05.numChildren = local_b08;
    statAABBNodesMB_05.numNodes = sStack_b30;
    statAABBNodesMB_05.nodeSAH = local_b38;
    statAABBNodesMB_05.numChildren = local_b28;
    statAABBNodesMB4D_05.numNodes = (size_t)dStack_b50;
    statAABBNodesMB4D_05.nodeSAH = (double)local_b58;
    statAABBNodesMB4D_05.numChildren = local_b48;
    statOBBNodesMB_05.numNodes = sStack_b70;
    statOBBNodesMB_05.nodeSAH = (double)local_b78;
    statOBBNodesMB_05.numChildren = (size_t)local_b68;
    statQuantizedNodes_05.numNodes = sStack_b90;
    statQuantizedNodes_05.nodeSAH = local_b98;
    statQuantizedNodes_05.numChildren = local_b88;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff2d8,statAABBNodes_05,statOBBNodes_05,
               statAABBNodesMB_05,statAABBNodesMB4D_05,statOBBNodesMB_05,statQuantizedNodes_05);
    local_bb0.func = &local_bc8;
    local_bc8.t0t1 = &t0t1_local;
    local_bb0.reduction = Statistics::add;
    local_bc8.n = &n;
    local_bb0.identity = &local_448;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_be0.my_end = 4;
    local_be0.my_begin = 0;
    local_be0.my_grainsize = 1;
    local_bf0.reduction = Statistics::add;
    local_bf0.func = &local_bb0;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
              (&v,&local_be0,&local_448,&local_bf0,Statistics::add,&context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    operator+((Statistics *)&context,__return_storage_ptr__,&v);
    memcpy(__return_storage_ptr__,(Statistics *)&context,0x108);
    psVar1 = &(__return_storage_ptr__->statQuantizedNodes).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statQuantizedNodes).nodeSAH =
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statQuantizedNodes).nodeSAH;
    break;
  case 6:
    n = (AABBNode *)(node.ptr & 0xfffffffffffffff0);
    Statistics::LeafStat::LeafStat(&local_260,0.0,0,0,0,0,0);
    local_978 = 0;
    uStack_970 = 0;
    local_968 = 0;
    local_998 = 0;
    uStack_990 = 0;
    local_988 = 0;
    local_9b8 = 0;
    uStack_9b0 = 0;
    local_9a8 = 0;
    local_9d8 = 0;
    uStack_9d0 = 0;
    local_9c8 = 0;
    local_9f8 = 0;
    uStack_9f0 = 0;
    local_9e8 = 0;
    local_a18 = 0;
    uStack_a10 = 0;
    local_a08 = 0;
    pLVar8 = &local_260;
    pdVar9 = (double *)&stack0xfffffffffffff2d8;
    for (lVar6 = 0xe; lVar6 != 0; lVar6 = lVar6 + -1) {
      *pdVar9 = pLVar8->leafSAH;
      pLVar8 = (LeafStat *)((long)pLVar8 + (ulong)bVar13 * -0x10 + 8);
      pdVar9 = pdVar9 + (ulong)bVar13 * -2 + 1;
    }
    statAABBNodes_02.numNodes = uStack_970;
    statAABBNodes_02.nodeSAH = (double)local_978;
    statAABBNodes_02.numChildren = local_968;
    statOBBNodes_02.numNodes = uStack_990;
    statOBBNodes_02.nodeSAH = (double)local_998;
    statOBBNodes_02.numChildren = local_988;
    statAABBNodesMB_02.numNodes = uStack_9b0;
    statAABBNodesMB_02.nodeSAH = (double)local_9b8;
    statAABBNodesMB_02.numChildren = local_9a8;
    statAABBNodesMB4D_02.numNodes = uStack_9d0;
    statAABBNodesMB4D_02.nodeSAH = (double)local_9d8;
    statAABBNodesMB4D_02.numChildren = local_9c8;
    statOBBNodesMB_02.numNodes = uStack_9f0;
    statOBBNodesMB_02.nodeSAH = (double)local_9f8;
    statOBBNodesMB_02.numChildren = local_9e8;
    statQuantizedNodes_02.numNodes = uStack_a10;
    statQuantizedNodes_02.nodeSAH = (double)local_a18;
    statQuantizedNodes_02.numChildren = local_a08;
    Statistics::Statistics
              (&local_448,0,in_stack_fffffffffffff2d8,statAABBNodes_02,statOBBNodes_02,
               statAABBNodesMB_02,statAABBNodesMB4D_02,statOBBNodesMB_02,statQuantizedNodes_02);
    local_bb0.func = &local_bc8;
    local_bc8.this = (BVHNStatistics<4> *)&t0t1_local;
    local_bb0.reduction = Statistics::add;
    local_bc8.n = &n;
    local_bb0.identity = &local_448;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_be0.my_end = 4;
    local_be0.my_begin = 0;
    local_be0.my_grainsize = 1;
    local_bf0.reduction = Statistics::add;
    local_bf0.func = &local_bb0;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<int>,_embree::BVHNStatistics<4>::Statistics,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_______common_algorithms_parallel_reduce_h:59:7),_embree::BVHNStatistics<4>::Statistics_(const_embree::BVHNStatistics<4>::Statistics_&,_const_embree::BVHNStatistics<4>::Statistics_&)>
              (&v,&local_be0,&local_448,&local_bf0,Statistics::add,&context);
    cVar3 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar3 != '\0') {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"task cancelled");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    operator+((Statistics *)&context,__return_storage_ptr__,&v);
    memcpy(__return_storage_ptr__,(Statistics *)&context,0x108);
    psVar1 = &(__return_storage_ptr__->statAABBNodesMB4D).numNodes;
    *psVar1 = *psVar1 + 1;
    (__return_storage_ptr__->statAABBNodesMB4D).nodeSAH =
         (double)local_c08._0_8_ * A + (__return_storage_ptr__->statAABBNodesMB4D).nodeSAH;
  }
  __return_storage_ptr__->depth = __return_storage_ptr__->depth + 1;
  return __return_storage_ptr__;
}

Assistant:

typename BVHNStatistics<N>::Statistics BVHNStatistics<N>::statistics(NodeRef node, const double A, const BBox1f t0t1)
  {
    Statistics s;
    assert(t0t1.size() > 0.0f);
    double dt = max(0.0f,t0t1.size());
    if (node.isAABBNode())
    {
      AABBNode* n = node.getAABBNode();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extend(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statAABBNodes.numChildren++;
          return s;
        }, Statistics::add);
      s.statAABBNodes.numNodes++;
      s.statAABBNodes.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isOBBNode())
    {
      OBBNode* n = node.ungetAABBNode();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extent(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statOBBNodes.numChildren++;
          return s;
        }, Statistics::add);
      s.statOBBNodes.numNodes++;
      s.statOBBNodes.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isAABBNodeMB())
    {
      AABBNodeMB* n = node.getAABBNodeMB();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,n->expectedHalfArea(i,t0t1));
          Statistics s = statistics(n->child(i),Ai,t0t1);
          s.statAABBNodesMB.numChildren++;
          return s;
        }, Statistics::add);
      s.statAABBNodesMB.numNodes++;
      s.statAABBNodesMB.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isAABBNodeMB4D())
    {
      AABBNodeMB4D* n = node.getAABBNodeMB4D();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const BBox1f t0t1i = intersect(t0t1,n->timeRange(i));
          assert(!t0t1i.empty());
          const double Ai = n->AABBNodeMB::expectedHalfArea(i,t0t1i);
          Statistics s =  statistics(n->child(i),Ai,t0t1i);
          s.statAABBNodesMB4D.numChildren++;
          return s;
        }, Statistics::add);
      s.statAABBNodesMB4D.numNodes++;
      s.statAABBNodesMB4D.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isOBBNodeMB())
    {
      OBBNodeMB* n = node.ungetAABBNodeMB();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extent0(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statOBBNodesMB.numChildren++;
          return s;
        }, Statistics::add);
      s.statOBBNodesMB.numNodes++;
      s.statOBBNodesMB.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isQuantizedNode())
    {
      QuantizedNode* n = node.quantizedNode();
      s = s + parallel_reduce(0,N,Statistics(),[&] ( const int i ) {
          if (n->child(i) == BVH::emptyNode) return Statistics();
          const double Ai = max(0.0f,halfArea(n->extent(i)));
          Statistics s = statistics(n->child(i),Ai,t0t1); 
          s.statQuantizedNodes.numChildren++;
          return s;
        }, Statistics::add);
      s.statQuantizedNodes.numNodes++;
      s.statQuantizedNodes.nodeSAH += dt*A;
      s.depth++;
    }
    else if (node.isLeaf())
    {
      size_t num; const char* tri = node.leaf(num);
      if (num)
      {
        for (size_t i=0; i<num; i++)
        {
          const size_t bytes = bvh->primTy->getBytes(tri);
          s.statLeaf.numPrimsActive += bvh->primTy->sizeActive(tri);
          s.statLeaf.numPrimsTotal += bvh->primTy->sizeTotal(tri);
          s.statLeaf.numBytes += bytes;
          tri+=bytes;
        }
        s.statLeaf.numLeaves++;
        s.statLeaf.numPrimBlocks += num;
        s.statLeaf.leafSAH += dt*A*num;
        if (num-1 < Statistics::LeafStat::NHIST) {
          s.statLeaf.numPrimBlocksHistogram[num-1]++;
        }
      }
    }
    else {
      throw std::runtime_error("not supported node type in bvh_statistics");
    }
    return s;
  }